

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O3

uint8_t * bam_aux_get(bam1_t *b,char *tag)

{
  char cVar1;
  char cVar2;
  int iVar3;
  ulong uVar4;
  ushort *puVar5;
  
  uVar4 = *(ulong *)&(b->core).field_0x8;
  iVar3 = (b->core).l_qseq;
  puVar5 = (ushort *)
           (b->data +
           (long)iVar3 + (long)(iVar3 + 1 >> 1) + (uVar4 >> 0x18 & 0xff) + (uVar4 >> 0x30) * 4);
  if (puVar5 < b->data + b->l_data) {
    cVar1 = *tag;
    cVar2 = tag[1];
    do {
      if ((uint)(ushort)(*puVar5 << 8 | *puVar5 >> 8) == ((int)cVar2 | (int)cVar1 << 8)) {
        return (uint8_t *)(puVar5 + 1);
      }
      puVar5 = (ushort *)skip_aux((uint8_t *)(puVar5 + 1));
    } while (puVar5 < b->data + b->l_data);
  }
  return (uint8_t *)0x0;
}

Assistant:

uint8_t *bam_aux_get(const bam1_t *b, const char tag[2])
{
    uint8_t *s;
    int y = tag[0]<<8 | tag[1];
    s = bam_get_aux(b);
    while (s < b->data + b->l_data) {
        int x = (int)s[0]<<8 | s[1];
        s += 2;
        if (x == y) return s;
        s = skip_aux(s);
    }
    return 0;
}